

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_>::~AttachmentPromiseNode
          (AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_> *this)

{
  NetworkAddress *pNVar1;
  Disposer *pDVar2;
  PromiseNode *pPVar3;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  pNVar1 = (this->attachment).ptr;
  if (pNVar1 != (NetworkAddress *)0x0) {
    (this->attachment).ptr = (NetworkAddress *)0x0;
    pDVar2 = (this->attachment).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pNVar1->_vptr_NetworkAddress[-2] + (long)&pNVar1->_vptr_NetworkAddress);
  }
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_0064c720;
  pPVar3 = (this->super_AttachmentPromiseNodeBase).dependency.ptr;
  if (pPVar3 != (PromiseNode *)0x0) {
    (this->super_AttachmentPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    pDVar2 = (this->super_AttachmentPromiseNodeBase).dependency.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
    return;
  }
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }